

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O2

void __thiscall ImGuiStorage::SetVoidPtr(ImGuiStorage *this,ImGuiID key,void *val)

{
  ImGuiStoragePair *it;
  ImGuiStoragePair local_28;
  
  it = LowerBound(&this->Data,key);
  if ((it == (this->Data).Data + (this->Data).Size) || (it->key != key)) {
    local_28.key = key;
    local_28.field_1.val_p = val;
    ImVector<ImGuiStorage::ImGuiStoragePair>::insert(&this->Data,it,&local_28);
  }
  else {
    (it->field_1).val_p = val;
  }
  return;
}

Assistant:

void ImGuiStorage::SetVoidPtr(ImGuiID key, void* val)
{
    ImGuiStoragePair* it = LowerBound(Data, key);
    if (it == Data.end() || it->key != key)
    {
        Data.insert(it, ImGuiStoragePair(key, val));
        return;
    }
    it->val_p = val;
}